

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O3

Section * getSection(char *name,SectionType type,uint32_t org,SectionSpec *attrs,SectionModifier mod
                    )

{
  ushort uVar1;
  SectionType SVar2;
  ulong uVar3;
  ushort uVar4;
  uint uVar5;
  int iVar6;
  uint32_t uVar7;
  Section *pSVar8;
  FileStackNode *pFVar9;
  uint8_t *puVar10;
  int *piVar11;
  char *pcVar12;
  uint uVar13;
  char *fmt;
  code *pcVar14;
  byte bVar15;
  bool bVar16;
  
  uVar3 = (ulong)type;
  uVar13 = attrs->bank;
  bVar15 = attrs->alignment;
  uVar1 = attrs->alignOfs;
  if (uVar13 == 0xffffffff) {
    uVar13 = 0xffffffff;
    if (sectionTypeInfo[uVar3].lastBank == sectionTypeInfo[uVar3].firstBank) {
      uVar13 = sectionTypeInfo[uVar3].firstBank;
    }
  }
  else if ((type & ~SECTTYPE_HRAM) - SECTTYPE_ROM0 < 0xfffffffe) {
    error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
  }
  else if (sectionTypeInfo[uVar3].lastBank < uVar13 || uVar13 < sectionTypeInfo[uVar3].firstBank) {
    error("%s bank value $%04x out of range ($%04x to $%04x)\n",sectionTypeInfo[uVar3].name,
          (ulong)uVar13);
  }
  uVar4 = uVar1;
  if (1 << (bVar15 & 0x1f) <= (int)(uint)uVar1) {
    uVar4 = 0;
    error("Alignment offset (%u) must be smaller than alignment size (%u)\n",(ulong)uVar1);
  }
  if ((org != 0xffffffff) &&
     (((ushort)(sectionTypeInfo[uVar3].size + sectionTypeInfo[uVar3].startAddr) - 1 & 0xffff) < org
      || org < sectionTypeInfo[uVar3].startAddr)) {
    error("Section \"%s\"\'s fixed address $%04x is outside of range [$%04x; $%04x]\n",name,
          (ulong)org);
  }
  if (bVar15 == 0) {
LAB_0011269c:
    bVar15 = 0;
  }
  else {
    if (0x10 < bVar15) {
      error("Alignment must be between 0 and 16, not %u\n",(ulong)bVar15);
      bVar15 = 0x10;
    }
    uVar5 = ~(-1 << (bVar15 & 0x1f));
    if (org == 0xffffffff) {
      if ((sectionTypeInfo[uVar3].startAddr & uVar5) == 0) {
        bVar16 = bVar15 != 0x10;
        if (!bVar16) {
          bVar15 = 0;
        }
        org = -(uint)bVar16;
      }
      else {
        bVar15 = 0;
        error("Section \"%s\"\'s alignment cannot be attained in %s\n",name,
              sectionTypeInfo[uVar3].name);
        org = 0;
      }
    }
    else {
      if ((org - uVar4 & uVar5) == 0) goto LAB_0011269c;
      bVar15 = 0;
      error("Section \"%s\"\'s fixed address doesn\'t match its alignment\n",name);
    }
  }
  pSVar8 = sect_FindSectionByName(name);
  if (pSVar8 == (Section *)0x0) {
    pSVar8 = (Section *)malloc(0x48);
    if (pSVar8 != (Section *)0x0) {
      pcVar12 = strdup(name);
      pSVar8->name = pcVar12;
      if (pcVar12 == (char *)0x0) {
        piVar11 = __errno_location();
        pcVar12 = strerror(*piVar11);
        fmt = "Not enough memory for section name: %s\n";
        goto LAB_001128df;
      }
      pSVar8->type = type;
      pSVar8->modifier = mod;
      pFVar9 = fstk_GetFileStack();
      pSVar8->src = pFVar9;
      uVar7 = lexer_GetLineNo();
      pSVar8->fileLine = uVar7;
      pSVar8->size = 0;
      pSVar8->org = org;
      pSVar8->bank = uVar13;
      pSVar8->align = bVar15;
      pSVar8->alignOfs = uVar4;
      pSVar8->next = (Section *)0x0;
      pSVar8->patches = (Patch *)0x0;
      if (type == SECTTYPE_INVALID) {
        __assert_fail("type != SECTTYPE_INVALID",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/include/linkdefs.hpp"
                      ,0x65,"bool sect_HasData(enum SectionType)");
      }
      if ((type & ~SECTTYPE_VRAM) != SECTTYPE_ROMX) {
        pSVar8->data = (uint8_t *)0x0;
LAB_0011287d:
        pSVar8->next = sectionList;
        sectionList = pSVar8;
        return pSVar8;
      }
      puVar10 = (uint8_t *)malloc((ulong)sectionTypeInfo[uVar3].size);
      pSVar8->data = puVar10;
      if (puVar10 != (uint8_t *)0x0) goto LAB_0011287d;
    }
    piVar11 = __errno_location();
    pcVar12 = strerror(*piVar11);
    fmt = "Not enough memory for section: %s\n";
LAB_001128df:
    fatalerror(fmt,pcVar12);
  }
  SVar2 = pSVar8->type;
  if (SVar2 != type) {
    error("Section already exists but with type %s\n",sectionTypeInfo[SVar2].name);
  }
  uVar5 = (uint)(SVar2 != type);
  if (pSVar8->modifier == mod) {
    if (mod - SECTION_UNION < 2) {
      pcVar14 = mergeFragments;
      if (mod == SECTION_UNION) {
        pcVar14 = mergeSectUnion;
      }
      iVar6 = (*pcVar14)(pSVar8,uVar3,org,bVar15,uVar4);
      uVar5 = iVar6 + uVar5;
      if (pSVar8->bank == 0xffffffff) {
        pSVar8->bank = uVar13;
      }
      else if (pSVar8->bank != uVar13 && uVar13 != 0xffffffff) {
        error("Section already declared with different bank %u\n");
        uVar5 = uVar5 + 1;
      }
    }
    else if (mod == SECTION_NORMAL) {
      error("Section already defined previously at ");
      fstk_Dump(pSVar8->src,pSVar8->fileLine);
      putc(10,_stderr);
      goto LAB_0011293a;
    }
    if (uVar5 == 0) {
      return pSVar8;
    }
  }
  else {
    error("Section already declared as %s section\n",sectionModNames[pSVar8->modifier]);
LAB_0011293a:
    uVar5 = uVar5 + 1;
  }
  pcVar12 = "s";
  if (uVar5 == 1) {
    pcVar12 = "";
  }
  fatalerror("Cannot create section \"%s\" (%u error%s)\n",pSVar8->name,(ulong)uVar5,pcVar12);
}

Assistant:

static struct Section *getSection(char const *name, enum SectionType type, uint32_t org,
				  struct SectionSpec const *attrs, enum SectionModifier mod)
{
	uint32_t bank = attrs->bank;
	uint8_t alignment = attrs->alignment;
	uint16_t alignOffset = attrs->alignOfs;

	// First, validate parameters, and normalize them if applicable

	if (bank != (uint32_t)-1) {
		if (type != SECTTYPE_ROMX && type != SECTTYPE_VRAM
		 && type != SECTTYPE_SRAM && type != SECTTYPE_WRAMX)
			error("BANK only allowed for ROMX, WRAMX, SRAM, or VRAM sections\n");
		else if (bank < sectionTypeInfo[type].firstBank || bank > sectionTypeInfo[type].lastBank)
			error("%s bank value $%04" PRIx32 " out of range ($%04" PRIx32 " to $%04"
				PRIx32 ")\n", sectionTypeInfo[type].name, bank,
				sectionTypeInfo[type].firstBank, sectionTypeInfo[type].lastBank);
	} else if (nbbanks(type) == 1) {
		// If the section type only has a single bank, implicitly force it
		bank = sectionTypeInfo[type].firstBank;
	}

	if (alignOffset >= 1 << alignment) {
		error("Alignment offset (%" PRIu16 ") must be smaller than alignment size (%u)\n",
		      alignOffset, 1U << alignment);
		alignOffset = 0;
	}

	if (org != (uint32_t)-1) {
		if (org < sectionTypeInfo[type].startAddr || org > endaddr(type))
			error("Section \"%s\"'s fixed address $%04" PRIx32
				" is outside of range [$%04" PRIx16 "; $%04" PRIx16 "]\n",
				name, org, sectionTypeInfo[type].startAddr, endaddr(type));
	}

	if (alignment != 0) {
		if (alignment > 16) {
			error("Alignment must be between 0 and 16, not %u\n", alignment);
			alignment = 16;
		}
		// It doesn't make sense to have both alignment and org set
		uint32_t mask = mask(alignment);

		if (org != (uint32_t)-1) {
			if ((org - alignOffset) & mask)
				error("Section \"%s\"'s fixed address doesn't match its alignment\n",
					name);
			alignment = 0; // Ignore it if it's satisfied
		} else if (sectionTypeInfo[type].startAddr & mask) {
			error("Section \"%s\"'s alignment cannot be attained in %s\n",
				name, sectionTypeInfo[type].name);
			alignment = 0; // Ignore it if it's unattainable
			org = 0;
		} else if (alignment == 16) {
			// Treat an alignment of 16 as being fixed at address 0
			alignment = 0;
			org = 0;
			// The address is known to be valid, since the alignment is
		}
	}

	// Check if another section exists with the same name; merge if yes, otherwise create one

	struct Section *sect = sect_FindSectionByName(name);

	if (sect) {
		mergeSections(sect, type, org, bank, alignment, alignOffset, mod);
	} else {
		sect = createSection(name, type, org, bank, alignment, alignOffset, mod);
		// Add the new section to the list (order doesn't matter)
		sect->next = sectionList;
		sectionList = sect;
	}

	return sect;
}